

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O2

void __thiscall
QPixmapStyle::copyDescriptor(QPixmapStyle *this,ControlDescriptor source,ControlDescriptor dest)

{
  QPixmapStyleDescriptor *this_00;
  QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> *this_01;
  long in_FS_OFFSET;
  QPixmapStyleDescriptor local_60;
  ControlDescriptor local_28;
  ControlDescriptor local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> *)
            (*(long *)&(this->super_QCommonStyle).super_QStyle.field_0x8 + 0xe8);
  local_28 = dest;
  local_24 = source;
  QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>::value(&local_60,this_01,&local_24)
  ;
  this_00 = QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>::operator[]
                      (this_01,&local_28);
  QPixmapStyleDescriptor::operator=(this_00,&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPixmapStyle::copyDescriptor(QPixmapStyle::ControlDescriptor source,
                                  QPixmapStyle::ControlDescriptor dest)
{
    Q_D(QPixmapStyle);
    d->descriptors[dest] = d->descriptors.value(source);
}